

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::resolveNewVertex
          (SignpostIntrinsicTriangulation *this,Vertex newV,SurfacePoint intrinsicPoint)

{
  SurfacePoint *pSVar1;
  IntrinsicGeometryInterface *geom;
  pointer puVar2;
  SurfacePoint *pSVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  size_t sVar6;
  Vector2 *pVVar7;
  pointer puVar8;
  undefined1 auVar9 [16];
  double dVar10;
  SurfacePoint startP;
  Vertex vert;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined1 auVar16 [16];
  ParentMeshT *pPVar17;
  size_t sVar18;
  ParentMeshT *pPVar19;
  ParentMeshT *pPVar20;
  char cVar21;
  char cVar22;
  bool bVar23;
  ulong uVar24;
  runtime_error *this_00;
  size_t i;
  int iVar25;
  ulong uVar26;
  int iVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  Halfedge he;
  Face f;
  Halfedge he_00;
  Halfedge he_01;
  Halfedge he_02;
  Vector2 VVar33;
  size_t local_1d8;
  ParentMeshT *local_1d0;
  ParentMeshT *local_1c0;
  NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> __begin2;
  double local_1a0;
  Vertex newV_local;
  Vector2 outgoingVec;
  Edge local_148;
  double local_138;
  double dStack_130;
  Vertex nextVOrig;
  TraceGeodesicResult inputTraceResult;
  
  newV_local.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  ind = newV.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
        ind;
  newV_local.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = newV.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
         .mesh;
  Vertex::incomingHalfedges
            ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
             &inputTraceResult,&newV_local);
  cVar21 = (char)inputTraceResult.endPoint.edge.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
  pPVar20 = inputTraceResult.endPoint.edge.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  __begin2.state.currE.
  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)inputTraceResult.endPoint._0_8_;
  __begin2.state.currE.
  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
       (size_t)inputTraceResult.endPoint.vertex.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
  __begin2.justStarted = true;
  cVar22 = '\x01';
  while ((cVar22 != cVar21 ||
         ((ParentMeshT *)
          __begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind != pPVar20))) {
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
         = __begin2.state.currE.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
         = __begin2.state.currE.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
    updateAngleFromCWNeighor(this,he);
    NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::operator++
              (&__begin2);
    cVar22 = __begin2.justStarted;
  }
  Vertex::adjacentFaces
            ((NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
             &inputTraceResult,&newV_local);
  NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::begin
            ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
             &__begin2,
             (NavigationSetBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
             &inputTraceResult);
  cVar21 = (char)inputTraceResult.endPoint.edge.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
  pPVar20 = inputTraceResult.endPoint.edge.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  while ((__begin2.justStarted != (bool)cVar21 ||
         ((ParentMeshT *)
          __begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind != pPVar20))) {
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         ((__begin2.state.currE.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start
         [__begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind];
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         __begin2.state.currE.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
         mesh;
    updateFaceBasis(this,f);
    NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator>::operator++
              ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentFaceNavigator> *)
               &__begin2);
  }
  local_1c0 = newV_local.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .mesh;
  uVar26 = ((newV_local.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start
           [newV_local.
            super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
            ind];
  if ((newV_local.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh)
      ->useImplicitTwinFlag == true) {
    uVar26 = uVar26 ^ 1;
  }
  else {
    uVar26 = ((newV_local.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar26];
  }
  Vertex::incomingHalfedges
            ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
             &inputTraceResult,&newV_local);
  cVar21 = (char)inputTraceResult.endPoint.edge.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .ind;
  pPVar20 = inputTraceResult.endPoint.edge.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  iVar25 = 9999;
  local_1d0 = (ParentMeshT *)0x0;
  __begin2.state.currE.
  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)inputTraceResult.endPoint._0_8_;
  __begin2.state.currE.
  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
       (size_t)inputTraceResult.endPoint.vertex.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh;
  __begin2.justStarted = true;
  while ((sVar6 = __begin2.state.currE.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind,
         pPVar17 = __begin2.state.currE.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .mesh, __begin2.justStarted != (bool)cVar21 ||
         ((ParentMeshT *)
          __begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind != pPVar20))) {
    if ((__begin2.state.currE.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh)->useImplicitTwinFlag == true) {
      uVar24 = __begin2.state.currE.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind >> 1;
    }
    else {
      uVar24 = ((__begin2.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start
               [__begin2.state.currE.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind];
    }
    iVar27 = 2 - (uint)((this->vertexLocations).data.
                        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
                        .m_storage.m_data
                        [(local_1c0->heVertexArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar26]].type == Vertex);
    if ((__begin2.state.currE.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh)->useImplicitTwinFlag == false) {
      outgoingVec.y =
           (double)((__begin2.state.currE.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh)->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [__begin2.state.currE.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind];
    }
    else {
      outgoingVec.y =
           (double)(__begin2.state.currE.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind >> 1);
    }
    dVar28 = (this->intrinsicEdgeLengths).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar24]
    ;
    outgoingVec.x =
         (double)__begin2.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
    bVar23 = Edge::isBoundary((Edge *)&outgoingVec);
    if (bVar23) {
      iVar27 = 3;
    }
    if ((iVar27 < iVar25) || ((iVar27 <= iVar25 && (dVar28 < (double)local_1d0)))) {
      local_1c0 = pPVar17;
      uVar26 = sVar6;
      iVar25 = iVar27;
      local_1d0 = (ParentMeshT *)dVar28;
    }
    NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::operator++
              (&__begin2);
  }
  if ((intrinsicPoint.type == Edge) &&
     (bVar23 = Edge::isBoundary(&intrinsicPoint.edge),
     pPVar19 = newV_local.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .mesh, bVar23)) {
    uVar24 = ((newV_local.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .mesh)->vHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start
             [newV_local.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind];
    if ((newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
        )->useImplicitTwinFlag == true) {
      uVar26 = uVar24 ^ 1;
    }
    else {
      uVar26 = ((newV_local.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar24];
    }
    puVar2 = ((newV_local.
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (this->vertexLocations).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
             .m_storage.m_data;
    uVar4 = puVar2[uVar26];
    if (pSVar3[uVar4].type == Vertex) {
      local_1a0 = 1.0;
      local_1d8 = 0xffffffffffffffff;
      local_1d0 = (ParentMeshT *)0x0;
    }
    else {
      local_1a0 = pSVar3[uVar4].tEdge;
      local_1d0 = pSVar3[uVar4].edge.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
      local_1d8 = pSVar3[uVar4].edge.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .ind;
    }
    if ((newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
        )->useImplicitTwinFlag == false) {
      puVar8 = ((newV_local.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar24 = puVar8[((newV_local.
                        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                       .mesh)->heNextArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[puVar8[uVar24]]];
    }
    else {
      uVar24 = ((newV_local.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar24 ^ 1] ^ 1;
    }
    uVar5 = puVar2[uVar24];
    if (pSVar3[uVar5].type == Vertex) {
      dVar28 = 0.0;
    }
    else {
      dVar28 = pSVar3[uVar5].tEdge;
      local_1d0 = pSVar3[uVar5].edge.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
      local_1d8 = pSVar3[uVar5].edge.
                  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .ind;
    }
    if (local_1d8 == 0xffffffffffffffff) {
      nextVOrig.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           pSVar3[uVar4].vertex.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      nextVOrig.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           pSVar3[uVar4].vertex.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
      sVar6 = pSVar3[uVar5].vertex.
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind;
      Vertex::incomingHalfedges
                ((NavigationSetBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator> *)
                 &inputTraceResult,&nextVOrig);
      __begin2.state.currE.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = (ParentMeshT *)inputTraceResult.endPoint._0_8_;
      __begin2.state.currE.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)inputTraceResult.endPoint.vertex.
                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
      __begin2.justStarted = true;
      local_1d8 = 0xffffffffffffffff;
      while ((sVar18 = __begin2.state.currE.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind,
             pPVar17 = __begin2.state.currE.
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .mesh,
             __begin2.justStarted !=
             (bool)(char)inputTraceResult.endPoint.edge.
                         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                         .ind ||
             ((ParentMeshT *)
              __begin2.state.currE.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .ind != inputTraceResult.endPoint.edge.
                      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                      .mesh))) {
        if (((__begin2.state.currE.
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start
            [__begin2.state.currE.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .ind] == sVar6) {
          if ((__begin2.state.currE.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->useImplicitTwinFlag == true) {
            local_148.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
                 = __begin2.state.currE.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind >> 1;
          }
          else {
            local_148.
            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
                 = ((__begin2.state.currE.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh)->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [__begin2.state.currE.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .ind];
          }
          local_148.
          super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
               = __begin2.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          bVar23 = Edge::isBoundary(&local_148);
          if (bVar23) {
            if (pPVar17->useImplicitTwinFlag == true) {
              local_1d8 = sVar18 >> 1;
              local_1d0 = pPVar17;
            }
            else {
              local_1d0 = pPVar17;
              local_1d8 = (pPVar17->heEdgeArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar18];
            }
          }
        }
        NavigationIteratorBase<geometrycentral::surface::VertexIncomingHalfedgeNavigator>::
        operator++(&__begin2);
      }
      if (local_1d8 == 0xffffffffffffffff) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (this_00,
                   "edge split problem: no boundary edge connecting vertices in boundary insertion")
        ;
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar28;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = intrinsicPoint.tEdge * local_1a0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = 1.0 - intrinsicPoint.tEdge;
    auVar9 = vfmadd213sd_fma(auVar31,auVar30,auVar29);
    inputTraceResult.endPoint.tEdge = auVar9._0_8_;
    inputTraceResult.endPoint.faceCoords.z = NAN;
    inputTraceResult.endPoint.type = Edge;
    inputTraceResult.endPoint._4_4_ = 0;
    inputTraceResult.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    inputTraceResult.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    inputTraceResult.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    inputTraceResult.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         inputTraceResult.endPoint.vertex.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
    local_1c0 = pPVar19;
    dVar28 = NAN;
    dVar32 = NAN;
  }
  else {
    __begin2.state.currE.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)
         ((ulong)__begin2.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh & 0xffffffffffff0000);
    __begin2.state.currE.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind = 0
    ;
    __begin2.justStarted = true;
    __begin2._17_7_ = 0xffffffffffffff;
    pSVar1 = (this->vertexLocations).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
             .m_storage.m_data;
    geom = this->inputGeom;
    uVar4 = (local_1c0->heVertexArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26];
    pSVar3 = pSVar1 + uVar4;
    uVar11 = pSVar3->type;
    uVar12 = *(undefined4 *)&pSVar3->field_0x4;
    auVar13 = *(undefined1 (*) [16])&pSVar3->vertex;
    auVar14 = *(undefined1 (*) [16])&pSVar3->edge;
    uVar15 = pSVar3->tEdge;
    auVar16 = *(undefined1 (*) [16])&pSVar3->face;
    startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
         = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)auVar16;
    startP.tEdge = (double)uVar15;
    startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
         = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)auVar14;
    startP.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> =
         (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)auVar13;
    startP._4_4_ = uVar12;
    startP.type = uVar11;
    dVar28 = pSVar1[uVar4].faceCoords.x;
    dVar32 = pSVar1[uVar4].faceCoords.y;
    dVar10 = pSVar1[uVar4].faceCoords.z;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = uVar26;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = local_1c0;
    VVar33 = halfedgeVector(this,he_00);
    startP.faceCoords.x = dVar28;
    startP.faceCoords.y = dVar32;
    startP.faceCoords.z = dVar10;
    traceGeodesic(&inputTraceResult,geom,startP,VVar33,(TraceOptions *)&__begin2);
    local_1d8 = CONCAT71(inputTraceResult.endPoint.edge.
                         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                         .ind._1_7_,
                         (char)inputTraceResult.endPoint.edge.
                               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                               .ind);
    local_138 = inputTraceResult.endPoint.faceCoords.x;
    dStack_130 = inputTraceResult.endPoint.faceCoords.y;
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    outgoingVec = (Vector2)vxorpd_avx512vl((undefined1  [16])inputTraceResult.endingDir,auVar9);
    ::std::
    _Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
    ::~_Vector_base(&inputTraceResult.pathPoints.
                     super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
                   );
    local_1d0 = inputTraceResult.endPoint.edge.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .mesh;
    dVar28 = local_138;
    dVar32 = dStack_130;
  }
  pSVar3 = (this->vertexLocations).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .type = inputTraceResult.endPoint.type;
  *(int *)&pSVar3[newV_local.
                  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                  .ind].field_0x4 = inputTraceResult.endPoint._4_4_;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .vertex.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = inputTraceResult.endPoint.vertex.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
  ;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .vertex.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
       = inputTraceResult.endPoint.vertex.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_1d0;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       local_1d8;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .tEdge = inputTraceResult.endPoint.tEdge;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       inputTraceResult.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       inputTraceResult.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .faceCoords.x = dVar28;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .faceCoords.y = dVar32;
  pSVar3[newV_local.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind]
  .faceCoords.z = inputTraceResult.endPoint.faceCoords.z;
  vert.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       newV_local.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
  vert.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       newV_local.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh;
  dVar28 = Vector2::arg(&outgoingVec);
  dVar28 = standardizeAngle(this,vert,dVar28);
  dVar28 = (double)((ulong)((local_1c0->heFaceArr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar26] <
                           local_1c0->nFacesFillCount) * (long)dVar28);
  if (local_1c0->useImplicitTwinFlag == true) {
    uVar24 = uVar26 ^ 1;
    (this->intrinsicHalfedgeDirections).data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar24] = dVar28
    ;
  }
  else {
    (this->intrinsicHalfedgeDirections).data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    [(local_1c0->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_start[uVar26]] = dVar28;
    uVar24 = (local_1c0->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar26];
  }
  he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
       = uVar24;
  he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
  mesh = local_1c0;
  VVar33 = halfedgeVector(this,he_01);
  bVar23 = local_1c0->useImplicitTwinFlag;
  if (bVar23 == true) {
    uVar24 = uVar26 ^ 1;
  }
  else {
    uVar24 = (local_1c0->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar26];
  }
  pVVar7 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar7[uVar24].x = VVar33.x;
  pVVar7[uVar24].y = VVar33.y;
  if (bVar23 == false) {
    puVar2 = (local_1c0->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (local_1c0->heNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar26 = puVar2[uVar26];
    uVar24 = puVar2[puVar8[puVar8[uVar26]]];
  }
  else {
    puVar2 = (local_1c0->heNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar26 = uVar26 ^ 1;
    uVar24 = puVar2[puVar2[uVar26]] ^ 1;
  }
  do {
    he_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = uVar24;
    he_02.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = local_1c0;
    updateAngleFromCWNeighor(this,he_02);
    if (local_1c0->nFacesFillCount <=
        (local_1c0->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar24]) {
      return;
    }
    puVar2 = (local_1c0->heNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar24 = puVar2[puVar2[uVar24]];
    if (local_1c0->useImplicitTwinFlag == true) {
      uVar24 = uVar24 ^ 1;
    }
    else {
      uVar24 = (local_1c0->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar24];
    }
  } while (uVar24 != uVar26);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::resolveNewVertex(Vertex newV, SurfacePoint intrinsicPoint) {

  // == (1) Compute angular coordinates for the halfedges
  // Now that we have valid edge lengths, compute halfedge angular coordinates for our new vertex
  for (Halfedge heIn : newV.incomingHalfedges()) {
    updateAngleFromCWNeighor(heIn);
  }

  // == (2) Set up bases on the intrinsic faces
  for (Face f : newV.adjacentFaces()) {
    updateFaceBasis(f);
  }

  // == (3) Find the insertion point on the input mesh, use it to align tangent spaces

  // Heuristic: we have to choose some edge to trace from to resolve the vertex. Use the shortest one, as it will often
  // involve the fewest crossings. Furthermore, use an original vertex if possible to reduce accumulating numerical
  // error.
  /*
  Halfedge inputTraceHe = newV.halfedge().twin();
  double shortestTraceHeLen = intrinsicEdgeLengths[inputTraceHe.edge()];
  for (Halfedge heIn : newV.incomingHalfedges()) {
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    bool currVertIsOriginal = vertexLocations[inputTraceHe.vertex()].type == SurfacePointType::Vertex;
    bool newVertIsOriginal = vertexLocations[heIn.vertex()].type == SurfacePointType::Vertex;

    if (currVertIsOriginal && !newVertIsOriginal) continue;

    if ((newVertIsOriginal && !currVertIsOriginal) || thisLen < shortestTraceHeLen) {
      shortestTraceHeLen = thisLen;
      inputTraceHe = heIn;
    }
  }
  */


  // We have to choose some edge to trace from to resolve the vertex. Choose from neighbors according to the following
  // priority:
  //  (best)    original points
  //  (neutral) other points
  //  (worst)   boundary points
  //  [break ties by shortest edge length]
  Halfedge inputTraceHe = newV.halfedge().twin();
  std::tuple<int, double> priorityBest{9999, 0};
  for (Halfedge heIn : newV.incomingHalfedges()) {

    // length score
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    // type score
    int numScore = 2;
    SurfacePoint candidateLoc = vertexLocations[inputTraceHe.vertex()];
    if (candidateLoc.type == SurfacePointType::Vertex) {
      numScore = 1;
    }
    if (heIn.edge().isBoundary()) {
      numScore = 3;
    }

    // combined score
    std::tuple<int, double> priorityThis{numScore, thisLen};

    // keep best
    if (priorityThis < priorityBest) {
      priorityBest = priorityThis;
      inputTraceHe = heIn;
    }
  }

  // Trace from the adjacent vertex selected above to get the position/angle on the input mesh
  SurfacePoint newPositionOnInput;
  Vector2 outgoingVec;

  bool boundaryEdgeInsertion = (intrinsicPoint.type == SurfacePointType::Edge && intrinsicPoint.edge.isBoundary());
  if (boundaryEdgeInsertion) {
    // For boundary vertices, instead of tracing, directly interpolate along the edge
    inputTraceHe = newV.halfedge().twin();

    // Get t values along the edge for previous and next vertices (note that we must be along a single edge)
    double tPrev, tNext;
    Edge origEdge;

    Vertex nextV = newV.halfedge().twin().vertex();
    if (vertexLocations[nextV].type == SurfacePointType::Vertex) {
      tNext = 1.;
    } else /* SurfacePointType::Edge */ {
      tNext = vertexLocations[nextV].tEdge;
      origEdge = vertexLocations[nextV].edge;
    }

    Vertex prevV = newV.halfedge().twin().next().twin().vertex();
    if (vertexLocations[prevV].type == SurfacePointType::Vertex) {
      tPrev = 0.;
    } else /* SurfacePointType::Edge */ {
      tPrev = vertexLocations[prevV].tEdge;
      origEdge = vertexLocations[prevV].edge;
    }

    // If neither was along an edge, find the (should-be-unique) boundary edge connecting the vertices
    if (origEdge == Edge()) {
      Vertex nextVOrig = vertexLocations[nextV].vertex;
      Vertex prevVOrig = vertexLocations[prevV].vertex;

      for (Halfedge he : nextVOrig.incomingHalfedges()) {
        if (he.vertex() == prevVOrig && he.edge().isBoundary()) {
          origEdge = he.edge();
        }
      }
    }

    if (origEdge == Edge()) {
      throw std::runtime_error("edge split problem: no boundary edge connecting vertices in boundary insertion");
    }

    // Interpolate between the previous and next t values
    double localT = intrinsicPoint.tEdge;
    double thisT = (1. - localT) * tPrev + (localT)*tNext;

    newPositionOnInput = SurfacePoint(origEdge, thisT);
  } else {
    // Normal case: trace an edge inward, use the result to resolve position and tangent basis
    // std::cout << "tracing to resolve new vertex" << std::endl;
    TraceOptions options;

    TraceGeodesicResult inputTraceResult =
        traceGeodesic(inputGeom, vertexLocations[inputTraceHe.vertex()], halfedgeVector(inputTraceHe), options);
    // std::cout << " --> done tracing to resolve new vertex" << std::endl;
    // snapEndToEdgeIfClose(inputTraceResult); TODO
    newPositionOnInput = inputTraceResult.endPoint;
    outgoingVec = -inputTraceResult.endingDir;
  }


  // Set the location of our newly inserted vertex
  vertexLocations[newV] = newPositionOnInput;

  // Align the new vertex's tangent space to that of the input mesh.
  double incomingAngle = standardizeAngle(newV, outgoingVec.arg());
  if (!inputTraceHe.isInterior()) {
    incomingAngle = 0;
  }

  intrinsicHalfedgeDirections[inputTraceHe.twin()] = incomingAngle;
  // halfedgeVectorsInVertex[inputTraceHe.twin()] = outgoingVec.normalize() * intrinsicEdgeLengths[inputTraceHe.edge()];
  halfedgeVectorsInVertex[inputTraceHe.twin()] = halfedgeVector(inputTraceHe.twin());

  // Custom loop to orbit CCW from InputTraceHe
  Halfedge firstHe = inputTraceHe.twin();
  Halfedge currHe = firstHe.next().next().twin();
  do {
    updateAngleFromCWNeighor(currHe);
    if (!currHe.isInterior()) break;
    currHe = currHe.next().next().twin();
  } while (currHe != firstHe);
}